

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::Event::armBreadthFirst(Event *this)

{
  Event **ppEVar1;
  EventLoop *this_00;
  long in_FS_OFFSET;
  Fault f;
  
  if (*(EventLoop **)(in_FS_OFFSET + -0x10) != (EventLoop *)0x0 &&
      *(EventLoop **)(in_FS_OFFSET + -0x10) != this->loop) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[129]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
               ,0x230,FAILED,"threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr",
               "\"Event armed from different thread than it was created in.  You must use \" \"the thread-safe work queue to queue events cross-thread.\""
               ,(char (*) [129])
                "Event armed from different thread than it was created in.  You must use the thread-safe work queue to queue events cross-thread."
              );
    Debug::Fault::fatal(&f);
  }
  if (this->prev != (Event **)0x0) {
    return;
  }
  ppEVar1 = this->loop->tail;
  this->next = *ppEVar1;
  this->prev = ppEVar1;
  *ppEVar1 = this;
  if (this->next != (Event *)0x0) {
    this->next->prev = &this->next;
  }
  this_00 = this->loop;
  this_00->tail = &this->next;
  EventLoop::setRunnable(this_00,true);
  return;
}

Assistant:

void Event::armBreadthFirst() {
  KJ_REQUIRE(threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr,
             "Event armed from different thread than it was created in.  You must use "
             "the thread-safe work queue to queue events cross-thread.");

  if (prev == nullptr) {
    next = *loop.tail;
    prev = loop.tail;
    *prev = this;
    if (next != nullptr) {
      next->prev = &next;
    }

    loop.tail = &next;

    loop.setRunnable(true);
  }
}